

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls_record.cc
# Opt level: O0

size_t bssl::dtls_seal_prefix_len(SSL *ssl,uint16_t epoch)

{
  DTLSWriteEpoch *pDVar1;
  size_t sVar2;
  pointer this;
  size_t sVar3;
  DTLSWriteEpoch *write_epoch;
  uint16_t epoch_local;
  SSL *ssl_local;
  
  pDVar1 = dtls_get_write_epoch(ssl,epoch);
  if (pDVar1 == (DTLSWriteEpoch *)0x0) {
    ssl_local = (SSL *)0x0;
  }
  else {
    sVar2 = dtls_record_header_write_len(ssl,epoch);
    this = std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator->(&pDVar1->aead)
    ;
    sVar3 = SSLAEADContext::ExplicitNonceLen(this);
    ssl_local = (SSL *)(sVar2 + sVar3);
  }
  return (size_t)ssl_local;
}

Assistant:

size_t dtls_seal_prefix_len(const SSL *ssl, uint16_t epoch) {
  DTLSWriteEpoch *write_epoch = dtls_get_write_epoch(ssl, epoch);
  if (write_epoch == nullptr) {
    return 0;
  }
  return dtls_record_header_write_len(ssl, epoch) +
         write_epoch->aead->ExplicitNonceLen();
}